

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O3

int16_t modify_stat_value(wchar_t value,wchar_t amount)

{
  int iVar1;
  wchar_t wVar2;
  
  if (amount < L'\x01') {
    if (amount < L'\0') {
      iVar1 = 1;
      wVar2 = value;
      if (1 < -amount) {
        iVar1 = -amount;
      }
      do {
        if (wVar2 < L'\x1c') {
          value = L'\x12';
          if (wVar2 < L'\x13') {
            value = wVar2 - (uint)(L'\x03' < wVar2);
          }
        }
        else {
          value = wVar2 + L'\xfffffff6';
        }
        iVar1 = iVar1 + -1;
        wVar2 = value;
      } while (iVar1 != 0);
    }
  }
  else {
    do {
      value = value + (uint)(L'\x11' < value) * 9 + L'\x01';
      amount = amount + L'\xffffffff';
    } while (amount != L'\0');
  }
  return (int16_t)value;
}

Assistant:

int16_t modify_stat_value(int value, int amount)
{
	int i;

	/* Reward or penalty */
	if (amount > 0) {
		/* Apply each point */
		for (i = 0; i < amount; i++) {
			/* One point at a time */
			if (value < 18) value++;

			/* Ten "points" at a time */
			else value += 10;
		}
	} else if (amount < 0) {
		/* Apply each point */
		for (i = 0; i < (0 - amount); i++) {
			/* Ten points at a time */
			if (value >= 18+10) value -= 10;

			/* Hack -- prevent weirdness */
			else if (value > 18) value = 18;

			/* One point at a time */
			else if (value > 3) value--;
		}
	}

	/* Return new value */
	return (value);
}